

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O1

void __thiscall GibbsSamplerFromHDP::runIteraions(GibbsSamplerFromHDP *this)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (this->_iterationNumber != 0) {
    uVar4 = 0;
    do {
      (*this->_vptr_GibbsSamplerFromHDP[1])(this);
      if (this->_J != 0) {
        uVar5 = 0;
        do {
          if ((this->_Tj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5] != 0) {
            uVar3 = 0;
            do {
              (*this->_vptr_GibbsSamplerFromHDP[2])(this,uVar5 & 0xffffffff,uVar3,0);
              uVar2 = (int)uVar3 + 1;
              uVar3 = (ulong)uVar2;
            } while (uVar2 < (this->_Tj).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar5]);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->_J);
      }
      (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
      (*this->_vptr_GibbsSamplerFromHDP[9])(this);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->_iterationNumber);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::runIteraions(){//{{{
    for(int i=0; i<_iterationNumber; i++){
        this->sampleTji();
        for(int j=0; j<_J; j++){
            for(int t=0; t<_Tj[j]; t++){
                this->sampleKjt(j, t);
            }
        }
        this->calculateExpectations(true);
        this->calculateLogLikelihood();
        // this->checkNumbers();
        cout<<_K<<endl;
        // if((i > _burnIn - 1) && ((i + 1) % _samplingInterval == 0)){
            // this->storeSamples();
        // }
    }
    // this->calculateExpectations();
}